

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportCommand.cxx
# Opt level: O2

bool __thiscall
cmExportCommand::InitialPass
          (cmExportCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  size_type sVar1;
  bool bVar2;
  TargetType TVar3;
  ostream *poVar4;
  string *psVar5;
  cmGlobalGenerator *this_00;
  iterator iVar6;
  cmExportBuildFileGenerator *pcVar7;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var8;
  cmTarget *this_01;
  string *ct;
  pointer pbVar9;
  pointer pbVar10;
  cmExportSet *exportSet;
  pair<__gnu_cxx::__normal_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>_>,_bool>
  pVar11;
  static_string_view name;
  static_string_view name_00;
  static_string_view name_01;
  string_view name_02;
  static_string_view name_03;
  static_string_view name_04;
  static_string_view name_05;
  string_view arg;
  string local_330;
  string fname;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  targets;
  cmArgumentParser<Arguments> parser;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keywordsMissingValue;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurationTypes;
  Arguments arguments;
  string local_50;
  
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)__lhs) < 0x21) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configurationTypes,"called with too few arguments",
               (allocator<char> *)&arguments);
    cmCommand::SetError(&this->super_cmCommand,(string *)&configurationTypes);
    std::__cxx11::string::~string((string *)&configurationTypes);
    return false;
  }
  bVar2 = std::operator==(__lhs,"PACKAGE");
  if (bVar2) {
    bVar2 = HandlePackage(this,args);
    return bVar2;
  }
  configurationTypes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  configurationTypes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  configurationTypes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  name.super_string_view._M_str = "NAMESPACE";
  name.super_string_view._M_len = 9;
  cmArgumentParser<cmExportCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
  ::Bind<std::__cxx11::string>
            ((cmArgumentParser<cmExportCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)&configurationTypes,name,0x38);
  name_00.super_string_view._M_str = "FILE";
  name_00.super_string_view._M_len = 4;
  cmArgumentParser<cmExportCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
  ::Bind<std::__cxx11::string>
            ((cmArgumentParser<cmExportCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)&configurationTypes,name_00,0x58);
  std::
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
  ::vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
            *)&parser,
           (vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
            *)&configurationTypes);
  std::
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
  ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
             *)&configurationTypes);
  bVar2 = std::operator==((args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start,"EXPORT");
  if (bVar2) {
    name_01.super_string_view._M_str = "EXPORT";
    name_01.super_string_view._M_len = 6;
    cmArgumentParser<cmExportCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExportCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&parser,name_01,0);
  }
  else {
    configurationTypes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    configurationTypes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x20;
    configurationTypes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  _Function_handler<void_(ArgumentParser::Instance_&,_void_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmArgumentParser.h:71:18)>
                  ::_M_manager;
    name_02._M_str = "TARGETS";
    name_02._M_len = 7;
    pVar11 = ArgumentParser::ActionMap::Emplace
                       (&parser.Bindings,name_02,(Action *)&configurationTypes);
    std::_Function_base::~_Function_base((_Function_base *)&configurationTypes);
    if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __assert_fail("inserted",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmArgumentParser.h"
                    ,0x4b,
                    "cmArgumentParser<Result> &cmArgumentParser<Arguments>::Bind(cm::static_string_view, T Result::*) [Result = Arguments, T = std::vector<std::basic_string<char>>]"
                   );
    }
    name_03.super_string_view._M_str = "ANDROID_MK";
    name_03.super_string_view._M_len = 10;
    cmArgumentParser<cmExportCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExportCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&parser,name_03,0x78);
    name_04.super_string_view._M_str = "APPEND";
    name_04.super_string_view._M_len = 6;
    cmArgumentParser<Arguments>::Bind<bool>(&parser,name_04,0x98);
    name_05.super_string_view._M_str = "EXPORT_LINK_INTERFACE_LIBRARIES";
    name_05.super_string_view._M_len = 0x1f;
    cmArgumentParser<Arguments>::Bind<bool>(&parser,name_05,0x99);
  }
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  keywordsMissingValue.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  arguments.ExportSetName._M_dataplus._M_p = (pointer)&arguments.ExportSetName.field_2;
  arguments.ExportSetName._M_string_length = 0;
  arguments.ExportSetName.field_2._M_local_buf[0] = '\0';
  arguments.Targets.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  arguments.Targets.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  arguments.Targets.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  arguments.Namespace._M_dataplus._M_p = (pointer)&arguments.Namespace.field_2;
  arguments.Namespace._M_string_length = 0;
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  keywordsMissingValue.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  keywordsMissingValue.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  arguments.Namespace.field_2._M_local_buf[0] = '\0';
  arguments.Filename._M_dataplus._M_p = (pointer)&arguments.Filename.field_2;
  arguments.Filename._M_string_length = 0;
  arguments.Filename.field_2._M_local_buf[0] = '\0';
  arguments.AndroidMKFile._M_dataplus._M_p = (pointer)&arguments.AndroidMKFile.field_2;
  arguments.AndroidMKFile._M_string_length = 0;
  arguments.AndroidMKFile.field_2._M_local_buf[0] = '\0';
  arguments.Append = false;
  arguments.ExportOld = false;
  configurationTypes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  configurationTypes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar10 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  configurationTypes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&parser;
  for (pbVar9 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      sVar1 = arguments.AndroidMKFile._M_string_length, pbVar9 != pbVar10; pbVar9 = pbVar9 + 1) {
    arg._M_str = (pbVar9->_M_dataplus)._M_p;
    arg._M_len = pbVar9->_M_string_length;
    ArgumentParser::Instance::Consume
              ((Instance *)&configurationTypes,arg,&arguments,&unknownArgs,&keywordsMissingValue);
  }
  if (unknownArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      unknownArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::operator+(&fname,"Unknown argument: \"",
                   unknownArgs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &configurationTypes,&fname,"\".");
    cmCommand::SetError(&this->super_cmCommand,(string *)&configurationTypes);
    std::__cxx11::string::~string((string *)&configurationTypes);
    std::__cxx11::string::~string((string *)&fname);
    bVar2 = false;
    goto LAB_001f965e;
  }
  fname._M_dataplus._M_p = (pointer)&fname.field_2;
  fname._M_string_length = 0;
  fname.field_2._M_local_buf[0] = '\0';
  if (arguments.AndroidMKFile._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&fname);
  }
  if (arguments.Filename._M_string_length == 0) {
    if (fname._M_string_length != 0) goto LAB_001f90df;
    bVar2 = std::operator!=((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start,"EXPORT");
    if (!bVar2) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &configurationTypes,&arguments.ExportSetName,".cmake");
      std::__cxx11::string::operator=((string *)&fname,(string *)&configurationTypes);
      std::__cxx11::string::~string((string *)&configurationTypes);
      goto LAB_001f90df;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configurationTypes,"FILE <filename> option missing.",
               (allocator<char> *)&local_330);
    cmCommand::SetError(&this->super_cmCommand,(string *)&configurationTypes);
    std::__cxx11::string::~string((string *)&configurationTypes);
LAB_001f917a:
    bVar2 = false;
  }
  else {
    if (fname._M_string_length == 0) {
      cmsys::SystemTools::GetFilenameLastExtension
                ((string *)&configurationTypes,&arguments.Filename);
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &configurationTypes,".cmake");
      std::__cxx11::string::~string((string *)&configurationTypes);
      if (!bVar2) {
        std::__cxx11::string::_M_assign((string *)&fname);
        goto LAB_001f90df;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&configurationTypes);
      poVar4 = std::operator<<((ostream *)&configurationTypes,"FILE option given filename \"");
      poVar4 = std::operator<<(poVar4,(string *)&arguments.Filename);
      std::operator<<(poVar4,"\" which does not have an extension of \".cmake\".\n");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&local_330);
LAB_001f9163:
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&configurationTypes);
      goto LAB_001f917a;
    }
LAB_001f90df:
    bVar2 = cmsys::SystemTools::FileIsFullPath(&fname);
    if (bVar2) {
      bVar2 = cmMakefile::CanIWriteThisFile((this->super_cmCommand).Makefile,&fname);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&configurationTypes);
        poVar4 = std::operator<<((ostream *)&configurationTypes,"FILE option given filename \"");
        poVar4 = std::operator<<(poVar4,(string *)&fname);
        std::operator<<(poVar4,"\" which is in the source tree.\n");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&local_330);
        goto LAB_001f9163;
      }
    }
    else {
      psVar5 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
      std::__cxx11::string::string((string *)&configurationTypes,(string *)psVar5);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &configurationTypes,"/");
      std::operator+(&local_330,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets,
                     &fname);
      std::__cxx11::string::operator=((string *)&fname,(string *)&local_330);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::~string((string *)&targets);
      std::__cxx11::string::~string((string *)&configurationTypes);
    }
    targets.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    targets.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    targets.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_00 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start,"EXPORT");
    if (bVar2) {
      iVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>_>
                      *)&this_00->ExportSets,&arguments.ExportSetName);
      if ((_Rb_tree_header *)iVar6._M_node ==
          &(this_00->ExportSets).
           super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>_>
           ._M_t._M_impl.super__Rb_tree_header) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&configurationTypes);
        poVar4 = std::operator<<((ostream *)&configurationTypes,"Export set \"");
        poVar4 = std::operator<<(poVar4,(string *)&arguments);
        std::operator<<(poVar4,"\" not found.");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&local_330);
LAB_001f959d:
        std::__cxx11::string::~string((string *)&local_330);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&configurationTypes);
LAB_001f9648:
        bVar2 = false;
      }
      else {
        exportSet = *(cmExportSet **)(iVar6._M_node + 2);
LAB_001f9251:
        if (sVar1 == 0) {
          pcVar7 = (cmExportBuildFileGenerator *)operator_new(0x140);
          cmExportBuildFileGenerator::cmExportBuildFileGenerator(pcVar7);
        }
        else {
          pcVar7 = (cmExportBuildFileGenerator *)operator_new(0x140);
          cmExportBuildAndroidMKGenerator::cmExportBuildAndroidMKGenerator
                    ((cmExportBuildAndroidMKGenerator *)pcVar7);
        }
        cmExportFileGenerator::SetExportFile
                  (&pcVar7->super_cmExportFileGenerator,fname._M_dataplus._M_p);
        std::__cxx11::string::_M_assign((string *)&(pcVar7->super_cmExportFileGenerator).Namespace);
        (pcVar7->super_cmExportFileGenerator).AppendMode = arguments.Append;
        if (exportSet == (cmExportSet *)0x0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(&pcVar7->Targets,&targets);
        }
        else {
          cmExportBuildFileGenerator::SetExportSet(pcVar7,exportSet);
        }
        cmMakefile::AddExportBuildFileGenerator((this->super_cmCommand).Makefile,pcVar7);
        (pcVar7->super_cmExportFileGenerator).ExportOld = arguments.ExportOld;
        configurationTypes.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        configurationTypes.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        configurationTypes.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        cmMakefile::GetConfigurations
                  (&local_50,(this->super_cmCommand).Makefile,&configurationTypes,true);
        std::__cxx11::string::~string((string *)&local_50);
        pbVar9 = configurationTypes.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pbVar10 = configurationTypes.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (configurationTypes.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            configurationTypes.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::emplace_back<>(&configurationTypes);
          pbVar9 = configurationTypes.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pbVar10 = configurationTypes.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        for (; pbVar9 != pbVar10; pbVar9 = pbVar9 + 1) {
          cmExportFileGenerator::AddConfiguration(&pcVar7->super_cmExportFileGenerator,pbVar9);
        }
        if (exportSet == (cmExportSet *)0x0) {
          cmGlobalGenerator::AddBuildExportSet(this_00,pcVar7);
        }
        else {
          cmGlobalGenerator::AddBuildExportExportSet(this_00,pcVar7);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&configurationTypes);
        bVar2 = true;
      }
    }
    else {
      if ((arguments.Targets.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           arguments.Targets.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) &&
         (_Var8 = std::
                  __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[8]>>
                            (keywordsMissingValue.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             keywordsMissingValue.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,"TARGETS"),
         _Var8._M_current ==
         keywordsMissingValue.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&configurationTypes,"EXPORT or TARGETS specifier missing.",
                   (allocator<char> *)&local_330);
        cmCommand::SetError(&this->super_cmCommand,(string *)&configurationTypes);
        psVar5 = (string *)&configurationTypes;
LAB_001f9643:
        std::__cxx11::string::~string((string *)psVar5);
        goto LAB_001f9648;
      }
      pbVar9 = arguments.Targets.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar10 = arguments.Targets.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar10 != pbVar9;
          pbVar10 = pbVar10 + 1) {
        bVar2 = cmMakefile::IsAlias((this->super_cmCommand).Makefile,pbVar10);
        if (bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&configurationTypes);
          poVar4 = std::operator<<((ostream *)&configurationTypes,"given ALIAS target \"");
          poVar4 = std::operator<<(poVar4,(string *)pbVar10);
          std::operator<<(poVar4,"\" which may not be exported.");
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&local_330);
          goto LAB_001f959d;
        }
        this_01 = cmGlobalGenerator::FindTarget(this_00,pbVar10,false);
        if (this_01 == (cmTarget *)0x0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&configurationTypes);
          poVar4 = std::operator<<((ostream *)&configurationTypes,"given target \"");
          poVar4 = std::operator<<(poVar4,(string *)pbVar10);
          std::operator<<(poVar4,"\" which is not built by this project.");
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&local_330);
          goto LAB_001f959d;
        }
        TVar3 = cmTarget::GetType(this_01);
        if (TVar3 == UTILITY) {
          std::operator+(&local_330,"given custom target \"",pbVar10);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &configurationTypes,&local_330,"\" which may not be exported.");
          cmCommand::SetError(&this->super_cmCommand,(string *)&configurationTypes);
          std::__cxx11::string::~string((string *)&configurationTypes);
          psVar5 = &local_330;
          goto LAB_001f9643;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&targets,pbVar10);
      }
      if ((arguments.Append != true) ||
         (pcVar7 = cmGlobalGenerator::GetExportedTargetsFile(this_00,&fname),
         pcVar7 == (cmExportBuildFileGenerator *)0x0)) {
        exportSet = (cmExportSet *)0x0;
        goto LAB_001f9251;
      }
      bVar2 = true;
      cmAppend<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&pcVar7->Targets,&targets);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&targets);
  }
  std::__cxx11::string::~string((string *)&fname);
LAB_001f965e:
  InitialPass::Arguments::~Arguments(&arguments);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&keywordsMissingValue);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unknownArgs);
  std::
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
  ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
             *)&parser);
  return bVar2;
}

Assistant:

bool cmExportCommand::InitialPass(std::vector<std::string> const& args,
                                  cmExecutionStatus&)
{
  if (args.size() < 2) {
    this->SetError("called with too few arguments");
    return false;
  }

  if (args[0] == "PACKAGE") {
    return this->HandlePackage(args);
  }

  struct Arguments
  {
    std::string ExportSetName;
    std::vector<std::string> Targets;
    std::string Namespace;
    std::string Filename;
    std::string AndroidMKFile;
    bool Append = false;
    bool ExportOld = false;
  };

  auto parser = cmArgumentParser<Arguments>{}
                  .Bind("NAMESPACE"_s, &Arguments::Namespace)
                  .Bind("FILE"_s, &Arguments::Filename);

  if (args[0] == "EXPORT") {
    parser.Bind("EXPORT"_s, &Arguments::ExportSetName);
  } else {
    parser.Bind("TARGETS"_s, &Arguments::Targets);
    parser.Bind("ANDROID_MK"_s, &Arguments::AndroidMKFile);
    parser.Bind("APPEND"_s, &Arguments::Append);
    parser.Bind("EXPORT_LINK_INTERFACE_LIBRARIES"_s, &Arguments::ExportOld);
  }

  std::vector<std::string> unknownArgs;
  std::vector<std::string> keywordsMissingValue;
  Arguments const arguments =
    parser.Parse(args, &unknownArgs, &keywordsMissingValue);

  if (!unknownArgs.empty()) {
    this->SetError("Unknown argument: \"" + unknownArgs.front() + "\".");
    return false;
  }

  std::string fname;
  bool android = false;
  if (!arguments.AndroidMKFile.empty()) {
    fname = arguments.AndroidMKFile;
    android = true;
  }
  if (arguments.Filename.empty() && fname.empty()) {
    if (args[0] != "EXPORT") {
      this->SetError("FILE <filename> option missing.");
      return false;
    }
    fname = arguments.ExportSetName + ".cmake";
  } else if (fname.empty()) {
    // Make sure the file has a .cmake extension.
    if (cmSystemTools::GetFilenameLastExtension(arguments.Filename) !=
        ".cmake") {
      std::ostringstream e;
      e << "FILE option given filename \"" << arguments.Filename
        << "\" which does not have an extension of \".cmake\".\n";
      this->SetError(e.str());
      return false;
    }
    fname = arguments.Filename;
  }

  // Get the file to write.
  if (cmSystemTools::FileIsFullPath(fname)) {
    if (!this->Makefile->CanIWriteThisFile(fname)) {
      std::ostringstream e;
      e << "FILE option given filename \"" << fname
        << "\" which is in the source tree.\n";
      this->SetError(e.str());
      return false;
    }
  } else {
    // Interpret relative paths with respect to the current build dir.
    std::string dir = this->Makefile->GetCurrentBinaryDirectory();
    fname = dir + "/" + fname;
  }

  std::vector<std::string> targets;

  cmGlobalGenerator* gg = this->Makefile->GetGlobalGenerator();

  cmExportSet* ExportSet = nullptr;
  if (args[0] == "EXPORT") {
    cmExportSetMap& setMap = gg->GetExportSets();
    auto const it = setMap.find(arguments.ExportSetName);
    if (it == setMap.end()) {
      std::ostringstream e;
      e << "Export set \"" << arguments.ExportSetName << "\" not found.";
      this->SetError(e.str());
      return false;
    }
    ExportSet = it->second;
  } else if (!arguments.Targets.empty() ||
             std::find(keywordsMissingValue.begin(),
                       keywordsMissingValue.end(),
                       "TARGETS") != keywordsMissingValue.end()) {
    for (std::string const& currentTarget : arguments.Targets) {
      if (this->Makefile->IsAlias(currentTarget)) {
        std::ostringstream e;
        e << "given ALIAS target \"" << currentTarget
          << "\" which may not be exported.";
        this->SetError(e.str());
        return false;
      }

      if (cmTarget* target = gg->FindTarget(currentTarget)) {
        if (target->GetType() == cmStateEnums::UTILITY) {
          this->SetError("given custom target \"" + currentTarget +
                         "\" which may not be exported.");
          return false;
        }
      } else {
        std::ostringstream e;
        e << "given target \"" << currentTarget
          << "\" which is not built by this project.";
        this->SetError(e.str());
        return false;
      }
      targets.push_back(currentTarget);
    }
    if (arguments.Append) {
      if (cmExportBuildFileGenerator* ebfg =
            gg->GetExportedTargetsFile(fname)) {
        ebfg->AppendTargets(targets);
        return true;
      }
    }
  } else {
    this->SetError("EXPORT or TARGETS specifier missing.");
    return false;
  }

  // Setup export file generation.
  cmExportBuildFileGenerator* ebfg = nullptr;
  if (android) {
    ebfg = new cmExportBuildAndroidMKGenerator;
  } else {
    ebfg = new cmExportBuildFileGenerator;
  }
  ebfg->SetExportFile(fname.c_str());
  ebfg->SetNamespace(arguments.Namespace);
  ebfg->SetAppendMode(arguments.Append);
  if (ExportSet != nullptr) {
    ebfg->SetExportSet(ExportSet);
  } else {
    ebfg->SetTargets(targets);
  }
  this->Makefile->AddExportBuildFileGenerator(ebfg);
  ebfg->SetExportOld(arguments.ExportOld);

  // Compute the set of configurations exported.
  std::vector<std::string> configurationTypes;
  this->Makefile->GetConfigurations(configurationTypes);
  if (configurationTypes.empty()) {
    configurationTypes.emplace_back();
  }
  for (std::string const& ct : configurationTypes) {
    ebfg->AddConfiguration(ct);
  }
  if (ExportSet != nullptr) {
    gg->AddBuildExportExportSet(ebfg);
  } else {
    gg->AddBuildExportSet(ebfg);
  }

  return true;
}